

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canLzma(void)

{
  wchar_t wVar1;
  
  if (canLzma::tested == L'\0') {
    canLzma::tested = L'\x01';
    wVar1 = systemf("lzma --help %s",redirectArgs);
    if (wVar1 == L'\0') {
      canLzma::value = L'\x01';
    }
  }
  return canLzma::value;
}

Assistant:

int
canLzma(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lzma --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}